

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3DLoader.h
# Opt level: O0

void __thiscall Assimp::Q3DImporter::Face::Face(Face *this,uint s)

{
  ulong __n;
  allocator<unsigned_int> local_25 [16];
  allocator<unsigned_int> local_15;
  uint local_14;
  Face *pFStack_10;
  uint s_local;
  Face *this_local;
  
  local_14 = s;
  pFStack_10 = this;
  std::allocator<unsigned_int>::allocator(&local_15);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->indices,(ulong)s,&local_15);
  std::allocator<unsigned_int>::~allocator(&local_15);
  __n = (ulong)local_14;
  std::allocator<unsigned_int>::allocator(local_25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->uvindices,__n,local_25);
  std::allocator<unsigned_int>::~allocator(local_25);
  this->mat = 0;
  return;
}

Assistant:

explicit Face(unsigned int s)
            :   indices   (s)
            ,   uvindices (s)
            ,   mat       (0)
        {
        }